

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O0

int yy_syntax_error_arguments(yypcontext_t *yyctx,yysymbol_kind_t *yyarg,int yyargn)

{
  yysymbol_kind_t *local_40;
  int local_28;
  int yyn;
  int yycount;
  int yyargn_local;
  yysymbol_kind_t *yyarg_local;
  yypcontext_t *yyctx_local;
  
  local_28 = 0;
  if (yyctx->yytoken != YYSYMBOL_YYEMPTY) {
    if (yyarg == (yysymbol_kind_t *)0x0) {
      local_40 = (yysymbol_kind_t *)0x0;
    }
    else {
      *yyarg = yyctx->yytoken;
      local_40 = yyarg + 1;
    }
    local_28 = yypcontext_expected_tokens(yyctx,local_40,yyargn + -1);
    if (local_28 == -2) {
      return -2;
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static int
yy_syntax_error_arguments (const yypcontext_t *yyctx,
                           yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;
  /* There are many possibilities here to consider:
     - If this state is a consistent state with a default action, then
       the only way this function was invoked is if the default action
       is an error action.  In that case, don't check for expected
       tokens because there are none.
     - The only way there can be no lookahead present (in yychar) is if
       this state is a consistent state with a default action.  Thus,
       detecting the absence of a lookahead is sufficient to determine
       that there is no unexpected or expected token to report.  In that
       case, just report a simple "syntax error".
     - Don't assume there isn't a lookahead just because this state is a
       consistent state with a default action.  There might have been a
       previous inconsistent state, consistent state with a non-default
       action, or user semantic action that manipulated yychar.
     - Of course, the expected token list depends on states to have
       correct lookahead information, and it depends on the parser not
       to perform extra reductions after fetching a lookahead from the
       scanner and before detecting a syntax error.  Thus, state merging
       (from LALR or IELR) and default reductions corrupt the expected
       token list.  However, the list is correct for canonical LR with
       one exception: it will still contain any token that will not be
       accepted due to an error action in a later state.
  */
  if (yyctx->yytoken != YYSYMBOL_YYEMPTY)
    {
      int yyn;
      if (yyarg)
        yyarg[yycount] = yyctx->yytoken;
      ++yycount;
      yyn = yypcontext_expected_tokens (yyctx,
                                        yyarg ? yyarg + 1 : yyarg, yyargn - 1);
      if (yyn == YYENOMEM)
        return YYENOMEM;
      else
        yycount += yyn;
    }
  return yycount;
}